

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O3

void Io_WriteDotNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,Vec_Ptr_t *vNodesShow,char *pFileName,
                   int fGateNames,int fUseReverse)

{
  uint *puVar1;
  char cVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  FILE *__stream;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  Mio_Gate_t *pGate;
  Abc_Obj_t *pAVar20;
  bool bVar21;
  int local_60;
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                  ,0x4f,
                  "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)");
  }
  if (vNodes->nSize < 1) {
    pcVar13 = "The set has no nodes. DOT file is not written.";
LAB_0034313f:
    puts(pcVar13);
    return;
  }
  if (500 < (uint)vNodes->nSize) {
    printf("The set has more than %d nodes. DOT file is not written.\n",500);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  bVar8 = true;
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    iVar9 = Abc_NtkBddToSop(pNtk,-1,1000000000);
    if (iVar9 == 0) {
      pcVar13 = "Io_WriteDotNtk(): Converting to SOPs has failed.";
      goto LAB_0034313f;
    }
    bVar8 = false;
  }
  if (0 < vNodes->nSize) {
    lVar12 = 0;
    do {
      puVar1 = (uint *)((long)vNodes->pArray[lVar12] + 0x14);
      *puVar1 = *puVar1 | 0x40;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodes->nSize);
  }
  if ((vNodesShow != (Vec_Ptr_t *)0x0) && (0 < vNodesShow->nSize)) {
    lVar12 = 0;
    do {
      puVar1 = (uint *)((long)vNodesShow->pArray[lVar12] + 0x14);
      *puVar1 = *puVar1 | 0x20;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodesShow->nSize);
  }
  iVar9 = Abc_NtkLevel(pNtk);
  if (fUseReverse == 0) {
    uVar16 = (ulong)(uint)vNodes->nSize;
  }
  else {
    iVar10 = Abc_NtkLevelReverse(pNtk);
    if (iVar9 != iVar10) {
      __assert_fail("LevelMax == LevelMin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                    ,0x7a,
                    "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)");
    }
    uVar16 = (ulong)(uint)vNodes->nSize;
    if (vNodes->nSize < 1) {
      uVar17 = 0xffffffff;
      uVar11 = 10000;
      local_60 = 0;
      bVar21 = true;
      goto LAB_00343398;
    }
    lVar12 = 0;
    do {
      uVar11 = *(uint *)((long)vNodes->pArray[lVar12] + 0x14);
      if ((uVar11 & 0xf) == 7) {
        *(uint *)((long)vNodes->pArray[lVar12] + 0x14) =
             (iVar9 - (uVar11 >> 0xc)) * 0x1000 + (uVar11 & 0xff7) + 0x1000;
        uVar16 = (ulong)(uint)vNodes->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar16);
  }
  if ((int)uVar16 < 1) {
    uVar17 = 0xffffffff;
    uVar11 = 10000;
  }
  else {
    uVar11 = 10000;
    uVar17 = 0xffffffff;
    uVar18 = 0;
    local_60 = 0;
    do {
      uVar19 = *(uint *)((long)vNodes->pArray[uVar18] + 0x14);
      if ((uVar19 & 0xf) - 5 < 0xfffffffe) {
        uVar19 = uVar19 >> 0xc;
        if (uVar19 <= uVar11) {
          uVar11 = uVar19;
        }
        if ((int)uVar17 <= (int)uVar19) {
          uVar17 = uVar19;
        }
      }
      else {
        local_60 = 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar16 != uVar18);
    bVar21 = local_60 == 0;
    if (!bVar21) {
      uVar17 = uVar17 + 1;
      if ((int)uVar16 < 1) {
        bVar21 = false;
      }
      else {
        lVar12 = 0;
        do {
          uVar19 = *(uint *)((long)vNodes->pArray[lVar12] + 0x14);
          if (0xfffffffd < (uVar19 & 0xf) - 5) {
            *(uint *)((long)vNodes->pArray[lVar12] + 0x14) = uVar19 & 0xfff | uVar17 * 0x1000;
            uVar16 = (ulong)(uint)vNodes->nSize;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (int)uVar16);
      }
      goto LAB_00343398;
    }
  }
  bVar21 = true;
  local_60 = 0;
LAB_00343398:
  fprintf(__stream,"# %s\n","Network structure generated by ABC");
  fputc(10,__stream);
  fwrite("digraph network {\n",0x12,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  uVar19 = uVar17;
  if ((int)uVar17 < (int)uVar11) {
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  }
  else {
    do {
      fprintf(__stream,"  Level%d",(ulong)uVar19);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
      bVar7 = (int)uVar11 < (int)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar7);
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    uVar19 = uVar17;
    if ((int)uVar11 <= (int)uVar17) {
      do {
        fprintf(__stream,"  Level%d",(ulong)uVar19);
        if (uVar11 == uVar19) {
          fputc(0x3b,__stream);
        }
        else {
          fwrite(" ->",3,1,__stream);
        }
        bVar7 = (int)uVar11 < (int)uVar19;
        uVar19 = uVar19 - 1;
      } while (bVar7);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("Network structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ",pNtk->pName);
  pcVar13 = Extra_TimeStamp();
  fprintf(__stream,"Time was %s. ",pcVar13);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  if (pNtk->nObjs == vNodes->nSize) {
    uVar19 = pNtk->nObjCounts[7];
    uVar15 = pNtk->nObjCounts[8];
    pcVar13 = "The network contains %d logic nodes and %d latches.";
  }
  else {
    uVar19 = Abc_NtkCountLogicNodes(vNodes);
    uVar15 = (uVar17 - uVar11) + 1;
    pcVar13 = "The set contains %d logic nodes and spans %d levels.";
  }
  fprintf(__stream,pcVar13,(ulong)uVar19,(ulong)uVar15);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  if (!bVar21) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",(ulong)uVar17);
    iVar9 = vNodes->nSize;
    if (0 < iVar9) {
      lVar12 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar12];
        uVar19 = *(uint *)&pAVar3->field_0x14 & 0xf;
        if (0xfffffffd < uVar19 - 5) {
          uVar15 = pAVar3->Id;
          pAVar20 = pAVar3;
          if (uVar19 == 4) {
            pAVar20 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray];
          }
          pcVar14 = Abc_ObjName(pAVar20);
          pcVar13 = "T = %d\t\t";
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 4) {
            pcVar13 = "mem_data_in";
          }
          fprintf(__stream,"  Node%d [label = \"%s%s\"",(ulong)uVar15,pcVar14,pcVar13 + 8);
          pcVar13 = "invtriangle";
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 4) {
            pcVar13 = "box";
          }
          fprintf(__stream,", shape = %s",pcVar13);
          if ((pAVar3->field_0x14 & 0x20) != 0) {
            fwrite(", style = filled",0x10,1,__stream);
          }
          fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
          fwrite("];\n",3,1,__stream);
          iVar9 = vNodes->nSize;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar9);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
  }
  uVar19 = uVar17 - local_60;
  if ((int)uVar11 <= (int)uVar19 && (uVar19 != 0 && local_60 <= (int)uVar17)) {
    uVar15 = 1;
    if (1 < uVar11) {
      uVar15 = uVar11;
    }
    do {
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fprintf(__stream,"  Level%d;\n",(ulong)uVar19);
      iVar9 = vNodes->nSize;
      if (0 < iVar9) {
        lVar12 = 0;
LAB_00343aed:
        pvVar4 = vNodes->pArray[lVar12];
        if ((*(uint *)((long)pvVar4 + 0x14) >> 0xc == uVar19) &&
           (*(int *)((long)pvVar4 + 0x1c) != 0)) {
          pcVar13 = "";
          if (pNtk->ntkType != ABC_NTK_STRASH) {
            pGate = *(Mio_Gate_t **)((long)pvVar4 + 0x38);
            if (pNtk->ntkFunc != ABC_FUNC_MAP || fGateNames == 0) {
              if (pNtk->ntkFunc != ABC_FUNC_MAP) {
                pcVar13 = &Abc_NtkPrintSop_Buffer;
                do {
                  cVar2 = *(char *)&pGate->pName;
                  if (cVar2 == '\n') {
                    pcVar13[0] = '\\';
                    pcVar13[1] = 'n';
                    pcVar13 = pcVar13 + 2;
                  }
                  else {
                    if (cVar2 == '\0') goto LAB_00343ba5;
                    *pcVar13 = cVar2;
                    pcVar13 = pcVar13 + 1;
                  }
                  pGate = (Mio_Gate_t *)((long)&pGate->pName + 1);
                } while( true );
              }
              pcVar13 = Mio_GateReadSop(pGate);
              pcVar14 = &Abc_NtkPrintSop_Buffer;
              do {
                cVar2 = *pcVar13;
                if (cVar2 == '\n') {
                  pcVar14[0] = '\\';
                  pcVar14[1] = 'n';
                  pcVar14 = pcVar14 + 2;
                }
                else {
                  if (cVar2 == '\0') goto LAB_00343b9f;
                  *pcVar14 = cVar2;
                  pcVar14 = pcVar14 + 1;
                }
                pcVar13 = pcVar13 + 1;
              } while( true );
            }
            pcVar13 = Mio_GateReadName(pGate);
          }
          goto LAB_00343bb0;
        }
        goto LAB_00343c1c;
      }
LAB_00343c2b:
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      bVar21 = (int)uVar15 < (int)uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar21);
  }
  if (uVar11 == 0) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",0);
    if (0 < vNodes->nSize) {
      lVar12 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar12];
        uVar11 = *(uint *)&pAVar3->field_0x14 & 0xf;
        if ((uVar11 == 2) || (uVar11 == 5)) {
          uVar19 = pAVar3->Id;
          pAVar20 = pAVar3;
          if (uVar11 == 5) {
            pAVar20 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
          }
          pcVar13 = Abc_ObjName(pAVar20);
          fprintf(__stream,"  Node%d [label = \"%s\"",(ulong)uVar19,pcVar13);
          pcVar13 = ", shape = triangle";
          if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 5) {
            pcVar13 = ", shape = box";
          }
          fprintf(__stream,", shape = %s",pcVar13 + 10);
LAB_00343d54:
          if ((pAVar3->field_0x14 & 0x20) != 0) {
            fwrite(", style = filled",0x10,1,__stream);
          }
          fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
          fwrite("];\n",3,1,__stream);
        }
        else if (((pAVar3->vFanins).nSize == 0) && (0 < (pAVar3->vFanouts).nSize)) {
          uVar11 = pAVar3->Id;
          uVar16 = 1;
          if (pAVar3->pNtk->ntkType != ABC_NTK_STRASH) {
            iVar9 = Abc_NodeIsConst1(pAVar3);
            uVar16 = (ulong)(iVar9 != 0);
          }
          fprintf(__stream,"  Node%d [label = \"Const%d\"",(ulong)uVar11,uVar16);
          fwrite(", shape = ellipse",0x11,1,__stream);
          goto LAB_00343d54;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < vNodes->nSize);
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
  }
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  iVar9 = vNodes->nSize;
  if (0 < iVar9) {
    lVar12 = 0;
    do {
      if (*(uint *)((long)vNodes->pArray[lVar12] + 0x14) >> 0xc == uVar17) {
        fprintf(__stream,"title2 -> Node%d [style = invis];\n",
                (ulong)*(uint *)((long)vNodes->pArray[lVar12] + 0x10));
        iVar9 = vNodes->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar9);
    if (0 < iVar9) {
      uVar16 = 0xffffffff;
      lVar12 = 0;
      do {
        pvVar4 = vNodes->pArray[lVar12];
        if ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 3 &&
            *(uint *)((long)pvVar4 + 0x14) >> 0xc == uVar17) {
          if (-1 < (int)uVar16) {
            fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar16,
                    (ulong)*(uint *)((long)pvVar4 + 0x10));
            iVar9 = vNodes->nSize;
          }
          uVar16 = (ulong)*(uint *)((long)pvVar4 + 0x10);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar9);
      if (0 < iVar9) {
        lVar12 = 0;
        do {
          plVar5 = (long *)vNodes->pArray[lVar12];
          if (((*(uint *)((long)plVar5 + 0x14) & 0xf) != 8) &&
             (iVar10 = *(int *)((long)plVar5 + 0x1c), 0 < iVar10)) {
            uVar16 = 0;
            do {
              lVar6 = *(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                               (long)*(int *)(plVar5[4] + uVar16 * 4) * 8);
              if ((*(uint *)(lVar6 + 0x14) & 0xf) != 8) {
                pcVar13 = "solid";
                if (pNtk->ntkType == ABC_NTK_STRASH) {
                  if (1 < uVar16) {
                    __assert_fail("i >=0 && i < 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                                  ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
                  }
                  pcVar13 = "dotted";
                  if ((*(uint *)((long)plVar5 + 0x14) & (uint)(uVar16 != 0) * 0x400 + 0x400) == 0) {
                    pcVar13 = "solid";
                  }
                }
                fprintf(__stream,"Node%d",(ulong)*(uint *)(plVar5 + 2));
                fwrite(" -> ",4,1,__stream);
                fprintf(__stream,"Node%d",(ulong)*(uint *)(lVar6 + 0x10));
                fprintf(__stream," [style = %s",pcVar13);
                fputc(0x5d,__stream);
                fwrite(";\n",2,1,__stream);
                iVar10 = *(int *)((long)plVar5 + 0x1c);
              }
              uVar16 = uVar16 + 1;
            } while ((long)uVar16 < (long)iVar10);
            iVar9 = vNodes->nSize;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar9);
      }
    }
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (0 < vNodes->nSize) {
    lVar12 = 0;
    do {
      puVar1 = (uint *)((long)vNodes->pArray[lVar12] + 0x14);
      *puVar1 = *puVar1 & 0xffffffbf;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodes->nSize);
  }
  if ((vNodesShow != (Vec_Ptr_t *)0x0) && (0 < vNodesShow->nSize)) {
    lVar12 = 0;
    do {
      puVar1 = (uint *)((long)vNodesShow->pArray[lVar12] + 0x14);
      *puVar1 = *puVar1 & 0xffffffdf;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodesShow->nSize);
  }
  if (!bVar8) {
    Abc_NtkSopToBdd(pNtk);
    return;
  }
  return;
LAB_00343ba5:
  pcVar13[-2] = '\0';
  goto LAB_00343ba9;
LAB_00343b9f:
  pcVar14[-2] = '\0';
LAB_00343ba9:
  pcVar13 = &Abc_NtkPrintSop_Buffer;
LAB_00343bb0:
  fprintf(__stream,"  Node%d [label = \"%d\\n%s\"",(ulong)*(uint *)((long)pvVar4 + 0x10),
          (ulong)*(uint *)((long)pvVar4 + 0x10),pcVar13);
  fwrite(", shape = ellipse",0x11,1,__stream);
  if ((*(byte *)((long)pvVar4 + 0x14) & 0x20) != 0) {
    fwrite(", style = filled",0x10,1,__stream);
  }
  fwrite("];\n",3,1,__stream);
  iVar9 = vNodes->nSize;
LAB_00343c1c:
  lVar12 = lVar12 + 1;
  if (iVar9 <= lVar12) goto LAB_00343c2b;
  goto LAB_00343aed;
}

Assistant:

void Io_WriteDotNtk( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, Vec_Ptr_t * vNodesShow, char * pFileName, int fGateNames, int fUseReverse )
{
    FILE * pFile;
    Abc_Obj_t * pNode, * pFanin;
    char * pSopString;
    int LevelMin, LevelMax, fHasCos, Level, i, k, fHasBdds, fCompl, Prev;
    int Limit = 500;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );

    if ( vNodes->nSize < 1 )
    {
        printf( "The set has no nodes. DOT file is not written.\n" );
        return;
    }

    if ( vNodes->nSize > Limit )
    {
        printf( "The set has more than %d nodes. DOT file is not written.\n", Limit );
        return;
    }

    // start the stream
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Io_WriteDotNtk(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // mark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 1;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 1;

    // get the levels of nodes
    LevelMax = Abc_NtkLevel( pNtk );
    if ( fUseReverse )
    {
        LevelMin = Abc_NtkLevelReverse( pNtk );
        assert( LevelMax == LevelMin );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            if ( Abc_ObjIsNode(pNode) )
                pNode->Level = LevelMax - pNode->Level + 1;
    }

    // find the largest and the smallest levels
    LevelMin = 10000;
    LevelMax = -1;
    fHasCos  = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsCo(pNode) )
        {
            fHasCos = 1;
            continue;
        }
        if ( LevelMin > (int)pNode->Level )
            LevelMin = pNode->Level;
        if ( LevelMax < (int)pNode->Level )
            LevelMax = pNode->Level;
    }

    // set the level of the CO nodes
    if ( fHasCos )
    {
        LevelMax++;
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( Abc_ObjIsCo(pNode) )
                pNode->Level = LevelMax;
        }
    }

    // write the DOT header
    fprintf( pFile, "# %s\n",  "Network structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph network {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//    fprintf( pFile, "size = \"10,8.5\";\n" );
//    fprintf( pFile, "size = \"14,11\";\n" );
//    fprintf( pFile, "page = \"8,11\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//    fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != LevelMin )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "Network structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", pNtk->pName );
    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    if ( Abc_NtkObjNum(pNtk) == Vec_PtrSize(vNodes) )
        fprintf( pFile, "The network contains %d logic nodes and %d latches.", Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk) );
    else
        fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Abc_NtkCountLogicNodes(vNodes), LevelMax - LevelMin + 1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the POs
    if ( fHasCos )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMax );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCo(pNode) )
                continue;
            fprintf( pFile, "  Node%d [label = \"%s%s\"", 
                pNode->Id, 
                (Abc_ObjIsBi(pNode)? Abc_ObjName(Abc_ObjFanout0(pNode)):Abc_ObjName(pNode)), 
                (Abc_ObjIsBi(pNode)? "_in":"") );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBi(pNode)? "box":"invtriangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate nodes of each rank
    for ( Level = LevelMax - fHasCos; Level >= LevelMin && Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;

/*
            int SuppSize;
            Vec_Ptr_t * vSupp;
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;
            vSupp = Abc_NtkNodeSupport( pNtk, &pNode, 1 );
            SuppSize = Vec_PtrSize( vSupp );
            Vec_PtrFree( vSupp ); 
*/

//            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            if ( Abc_NtkIsStrash(pNtk) )
                pSopString = "";
            else if ( Abc_NtkHasMapping(pNtk) && fGateNames )
                pSopString = Mio_GateReadName((Mio_Gate_t *)pNode->pData);
            else if ( Abc_NtkHasMapping(pNtk) )
                pSopString = Abc_NtkPrintSop(Mio_GateReadSop((Mio_Gate_t *)pNode->pData));
            else
                pSopString = Abc_NtkPrintSop((char *)pNode->pData);
            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, pNode->Id, pSopString );
//            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, 
//                SuppSize, 
//                pSopString );

            fprintf( pFile, ", shape = ellipse" );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the PI nodes if any
    if ( LevelMin == 0 )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMin );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCi(pNode) )
            {
                // check if the costant node is present
                if ( Abc_ObjFaninNum(pNode) == 0 && Abc_ObjFanoutNum(pNode) > 0 )
                {
                    fprintf( pFile, "  Node%d [label = \"Const%d\"", pNode->Id, Abc_NtkIsStrash(pNode->pNtk) || Abc_NodeIsConst1(pNode) );
                    fprintf( pFile, ", shape = ellipse" );
                    if ( pNode->fMarkB )
                        fprintf( pFile, ", style = filled" );
                    fprintf( pFile, ", color = coral, fillcolor = coral" );
                    fprintf( pFile, "];\n" );
                }
                continue;
            }
            fprintf( pFile, "  Node%d [label = \"%s\"", 
                pNode->Id, 
                (Abc_ObjIsBo(pNode)? Abc_ObjName(Abc_ObjFanin0(pNode)):Abc_ObjName(pNode)) );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBo(pNode)? "box":"triangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        if ( !Abc_ObjIsPo(pNode) )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
            continue;
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsLatch(pFanin) )
                continue;
            fCompl = 0;
            if ( Abc_NtkIsStrash(pNtk) )
                fCompl = Abc_ObjFaninC(pNode, k);
            // generate the edge from this node to the next
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pFanin->Id );
            fprintf( pFile, " [style = %s", fCompl? "dotted" : "solid" );
//            fprintf( pFile, ", label = \"%c\"", 'a' + k );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 0;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 0;

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}